

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_list.hpp
# Opt level: O2

torrent * __thiscall
libtorrent::aux::torrent_list<libtorrent::aux::torrent>::find_obfuscated
          (torrent_list<libtorrent::aux::torrent> *this,sha1_hash *ih)

{
  iterator iVar1;
  torrent *ptVar2;
  
  iVar1 = ::std::
          _Hashtable<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<160L>_>,_std::hash<libtorrent::digest32<160L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_obfuscated_index)._M_h,ih);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    ptVar2 = (torrent *)0x0;
  }
  else {
    ptVar2 = *(torrent **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_true>
                     ._M_cur + 0x20);
  }
  return ptVar2;
}

Assistant:

T* find_obfuscated(sha1_hash const& ih)
	{
		auto const i = m_obfuscated_index.find(ih);
		if (i == m_obfuscated_index.end()) return nullptr;
		return i->second;
	}